

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  uint uVar7;
  int unaff_R14D;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool SRArgumentSpecified;
  string arg;
  string errormsg;
  string targ;
  bool local_231;
  size_t local_230;
  uint local_228;
  uint local_224;
  long *local_220 [2];
  long local_210 [2];
  string local_200;
  _Rb_tree_node_base *local_1e0;
  string *local_1d8;
  string *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_231 = false;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,
             (this->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_230 = 1;
  bVar9 = (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21;
  bVar10 = !bVar9;
  if (bVar9) {
    uVar7 = 1;
    uVar8 = 0;
  }
  else {
    local_1d0 = &this->ScheduleType;
    local_1e0 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228 = (uint)CONCAT71((int7)((ulong)local_1e0 >> 8),1);
    local_224 = 0;
    local_1d8 = output;
    do {
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      local_200._M_string_length = 0;
      local_200.field_2._M_local_buf[0] = '\0';
      bVar9 = HandleCommandLineArguments(this,&local_230,args,&local_200);
      if (bVar9) {
        HandleScriptArguments(this,&local_230,args,&local_231);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_220[0] = local_210;
        pcVar2 = pbVar1[local_230]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_220,pcVar2,pcVar2 + pbVar1[local_230]._M_string_length);
        iVar4 = std::__cxx11::string::compare((char *)local_220);
        if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_220), iVar4 == 0))
           && (pbVar1 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_230 <
              ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U)) {
          this->ProduceXML = true;
          local_230 = local_230 + 1;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          pcVar2 = pbVar1[local_230]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + pbVar1[local_230]._M_string_length);
          bVar9 = AddTestsForDashboardType(this,local_1a8);
          if ((!bVar9) && (bVar9 = AddVariableDefinition(this,local_1a8), !bVar9)) {
            ErrorMessageUnknownDashDValue(this,local_1a8);
            local_228 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        iVar4 = std::__cxx11::string::compare((char *)local_220);
        if ((iVar4 != 0) &&
           (bVar9 = cmsys::SystemTools::StringStartsWith((char *)local_220[0],"-D"), bVar9)) {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_220);
          AddVariableDefinition(this,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        bVar9 = HandleTestActionArgument(this,"ctest",&local_230,args);
        bVar3 = HandleTestModelArgument(this,"ctest",&local_230,args);
        local_228 = local_228 & 0xff;
        if (!bVar3) {
          local_228 = 0;
        }
        if (!bVar9) {
          local_228 = 0;
        }
        iVar4 = std::__cxx11::string::compare((char *)local_220);
        if ((iVar4 == 0) &&
           (local_230 <
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          this->ProduceXML = true;
          SetTest(this,"Submit",true);
          local_230 = local_230 + 1;
          bVar3 = SubmitExtraFiles(this,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[local_230].
                                        _M_dataplus._M_p);
          bVar9 = false;
          if (bVar3) goto LAB_00150042;
          unaff_R14D = 0;
        }
        else {
LAB_00150042:
          iVar4 = std::__cxx11::string::compare((char *)local_220);
          if ((iVar4 == 0) &&
             (local_224 = local_224 & 0xff,
             local_230 <
             ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            local_224 = 1;
          }
          iVar4 = std::__cxx11::string::compare((char *)local_220);
          if (iVar4 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_1d0,0,(char *)(this->ScheduleType)._M_string_length,0x53ae12);
          }
          p_Var6 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar9 = p_Var6 == local_1e0;
          while (!bVar9) {
            iVar4 = (**(code **)(**(long **)(p_Var6 + 2) + 0x10))
                              (*(long **)(p_Var6 + 2),local_220,&local_230,args);
            if (iVar4 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Problem parsing command line arguments within a handler",0x37);
              std::__cxx11::stringbuf::str();
              Log(this,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
                  ,0x8c6,(char *)local_1c8,false);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              unaff_R14D = 0;
            }
            if (iVar4 == 0) break;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            bVar9 = p_Var6 == local_1e0;
          }
        }
        if (local_220[0] != local_210) {
          operator_delete(local_220[0],local_210[0] + 1);
        }
      }
      else {
        cmSystemTools::Error(&local_200);
        unaff_R14D = 1;
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,
                        CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                                 local_200.field_2._M_local_buf[0]) + 1);
      }
      output = local_1d8;
      uVar7 = local_228;
      uVar8 = local_224;
      if (!bVar9) break;
      local_230 = local_230 + 1;
      bVar10 = local_230 <
               (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5);
    } while (bVar10);
  }
  if (!bVar10) {
    if (this->ParallelLevelSetInCli == false) {
      local_1a8[0]._M_string_length = 0;
      local_1a8[0].field_2._M_local_buf[0] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      bVar10 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",local_1a8);
      if (bVar10) {
        iVar5 = atoi(local_1a8[0]._M_dataplus._M_p);
        iVar4 = 1;
        if (1 < iVar5) {
          iVar4 = iVar5;
        }
        this->ParallelLevel = iVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1a8[0].field_2._M_local_buf[0]) + 1);
      }
    }
    bVar10 = false;
    if ((this->TestProgressOutput == true) &&
       (bVar10 = false, this->OutputLogFile == (cmGeneratedFileStream *)0x0)) {
      bVar10 = ConsoleIsNotDumb();
    }
    this->TestProgressOutput = bVar10;
    if ((uVar8 & 1) == 0) {
      unaff_R14D = 1;
      if ((uVar7 & 1) != 0) {
        unaff_R14D = ExecuteTests(this);
      }
    }
    else {
      unaff_R14D = RunCMakeAndTest(this,output);
    }
  }
  return unaff_R14D;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
    this->InitialCommandLineArguments.end(), args.begin(), args.end());

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->TestingHandlers) {
      if (!handler.second->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->TestProgressOutput = this->TestProgressOutput &&
    !this->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}